

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Printer *this_00;
  pointer pcVar1;
  int x;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_b1;
  char *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = this->printer_;
  local_b0 = format;
  ToString<int,void>(&local_90,(Formatter *)(ulong)(uint)*args,(int)args);
  ToString<int,void>(&local_70,(Formatter *)(ulong)(uint)*args_1,x);
  local_50[0] = local_40;
  pcVar1 = (args_2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + args_2->_M_string_length);
  __l._M_len = 3;
  __l._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l,&local_b1);
  io::Printer::FormatInternal(this_00,&local_a8,&this->vars_,local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  lVar2 = 0;
  do {
    if (local_40 + lVar2 != *(undefined1 **)((long)local_50 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }